

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O0

void __thiscall tst_qpromise_map::delayedFulfilled(tst_qpromise_map *this)

{
  initializer_list<int> args;
  initializer_list<int> args_00;
  Type TVar1;
  int local_dc [3];
  iterator local_d0;
  undefined8 local_c8;
  QList<int> local_c0;
  QList<int> local_a8;
  QList<int> local_90;
  int local_64 [3];
  iterator local_58;
  undefined8 local_50;
  QList<int> local_48;
  QPromise<QList<int>_> local_30;
  undefined1 local_20 [8];
  PromiseType p;
  tst_qpromise_map *this_local;
  
  local_64[0] = 0x2a;
  local_64[1] = 0x2b;
  local_64[2] = 0x2c;
  local_58 = local_64;
  local_50 = 3;
  args_00._M_len = 3;
  args_00._M_array = local_58;
  p.super_QPromiseBase<QList<int>_>.m_d.d = (PromiseData<QList<int>_> *)this;
  QList<int>::QList(&local_48,args_00);
  TVar1 = QtPromise::resolve<QList<int>>((QtPromise *)&local_30,&local_48);
  QtPromise::QPromise<QList<int>>::map<tst_qpromise_map::delayedFulfilled()::__0>
            ((QPromise<QList<int>> *)local_20,&local_30,
             TVar1.super_QPromiseBase<QList<int>_>.m_d.d.d);
  QtPromise::QPromise<QList<int>_>::~QPromise(&local_30);
  QList<int>::~QList(&local_48);
  local_a8.d.d = (Data *)0x0;
  local_a8.d.ptr = (int *)0x0;
  local_a8.d.size = 0;
  QList<int>::QList(&local_a8);
  waitForValue<QList<int>>(&local_90,(QPromise<QList<int>_> *)local_20,&local_a8);
  local_dc[0] = 0x2b;
  local_dc[1] = 0x2c;
  local_dc[2] = 0x2d;
  local_d0 = local_dc;
  local_c8 = 3;
  args._M_len = 3;
  args._M_array = local_d0;
  QList<int>::QList(&local_c0,args);
  QTest::qCompare<int>
            (&local_90,&local_c0,"waitForValue(p, QVector<int>{})","(QVector<int>{43, 44, 45})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_map.cpp"
             ,0x66);
  QList<int>::~QList(&local_c0);
  QList<int>::~QList(&local_90);
  QList<int>::~QList(&local_a8);
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)local_20);
  return;
}

Assistant:

void tst_qpromise_map::delayedFulfilled()
{
    auto p = QtPromise::resolve(QVector<int>{42, 43, 44}).map([](int v, ...) {
        return QtPromise::QPromise<int>{[&](const QtPromise::QPromiseResolve<int>& resolve) {
            QtPromisePrivate::qtpromise_defer([=]() {
                resolve(v + 1);
            });
        }};
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{43, 44, 45}));
}